

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O3

Status __thiscall
sentencepiece::SentencePieceTrainer::MergeSpecsFromArgs
          (SentencePieceTrainer *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *kwargs,TrainerSpec *trainer_spec,NormalizerSpec *normalizer_spec,
          NormalizerSpec *denormalizer_spec)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  StatusCode SVar4;
  NormalizerSpec *result;
  void *pvVar5;
  _Hash_node_base *p_Var6;
  Status *s;
  string_view s_00;
  string_view name;
  string_view name_00;
  string_view value;
  string_view value_00;
  Status status_norm;
  Status status_train;
  Status local_1d8;
  _Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false> local_1d0;
  ArenaStringPtr *local_1c8;
  ArenaStringPtr *local_1c0;
  TrainerSpec *local_1b8;
  Status local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0._M_head_impl = (Rep *)this;
  local_1b8 = trainer_spec;
  if (trainer_spec == (TrainerSpec *)0x0) {
    local_1b0.rep_._M_t.
    super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
    .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"third_party/sentencepiece/src/sentencepiece_trainer.cc",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    std::ostream::operator<<(local_1a8,0x85);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"trainer_spec",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"`trainer_spec` must not be null.",0x20);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)local_1d0._M_head_impl);
  }
  else if (normalizer_spec == (NormalizerSpec *)0x0) {
    local_1b0.rep_._M_t.
    super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
    .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"third_party/sentencepiece/src/sentencepiece_trainer.cc",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    std::ostream::operator<<(local_1a8,0x86);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"normalizer_spec",0xf);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"`normalizer_spec` must not be null.",0x23);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)local_1d0._M_head_impl);
  }
  else {
    if (denormalizer_spec != (NormalizerSpec *)0x0) {
      p_Var6 = (kwargs->_M_h)._M_before_begin._M_nxt;
      if (p_Var6 != (_Hash_node_base *)0x0) {
        local_1c8 = &denormalizer_spec->normalization_rule_tsv_;
        local_1c0 = &normalizer_spec->name_;
        result = normalizer_spec;
        do {
          p_Var1 = p_Var6 + 1;
          iVar3 = std::__cxx11::string::compare((char *)p_Var1);
          if (iVar3 == 0) {
            *(byte *)(normalizer_spec->_has_bits_).has_bits_ =
                 (byte)(normalizer_spec->_has_bits_).has_bits_[0] | 1;
            pvVar5 = (normalizer_spec->super_MessageLite)._internal_metadata_.ptr_;
            if (((ulong)pvVar5 & 1) != 0) {
              pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
            }
            google::protobuf::internal::ArenaStringPtr::Set(local_1c0,p_Var6 + 5,pvVar5);
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)p_Var1);
            if (iVar3 == 0) {
              *(byte *)(denormalizer_spec->_has_bits_).has_bits_ =
                   (byte)(denormalizer_spec->_has_bits_).has_bits_[0] | 4;
              pvVar5 = (denormalizer_spec->super_MessageLite)._internal_metadata_.ptr_;
              if (((ulong)pvVar5 & 1) != 0) {
                pvVar5 = *(void **)((ulong)pvVar5 & 0xfffffffffffffffe);
              }
              google::protobuf::internal::ArenaStringPtr::Set(local_1c8,p_Var6 + 5,pvVar5);
              denormalizer_spec->add_dummy_prefix_ = false;
              denormalizer_spec->remove_extra_whitespaces_ = false;
              *(byte *)(denormalizer_spec->_has_bits_).has_bits_ =
                   (byte)(denormalizer_spec->_has_bits_).has_bits_[0] | 0x38;
              denormalizer_spec->escape_whitespaces_ = false;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)p_Var1);
              if (iVar3 == 0) {
                local_1d8.rep_._M_t.
                super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                ._M_t.
                super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_
                     = 0;
                s_00._M_str = (char *)&local_1d8;
                s_00._M_len = (size_t)p_Var6[5]._M_nxt;
                bVar2 = absl::SimpleAtoi<int>((absl *)p_Var6[6]._M_nxt,s_00,(int *)result);
                if (bVar2) {
                  logging::SetMinLogLevel
                            ((int)local_1d8.rep_._M_t.
                                  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                                  _M_head_impl);
                  iVar3 = 3;
                }
                else {
                  local_1b0.rep_._M_t.
                  super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl.
                  _0_4_ = 0xd;
                  std::__cxx11::ostringstream::ostringstream(local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "third_party/sentencepiece/src/sentencepiece_trainer.cc",0x36);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
                  std::ostream::operator<<(local_1a8,0x98);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") [",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"absl::SimpleAtoi(value, &v)",0x1b);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] ",2);
                  util::StatusBuilder::operator_cast_to_Status
                            ((StatusBuilder *)local_1d0._M_head_impl);
                  std::__cxx11::ostringstream::~ostringstream(local_1a8);
                  std::ios_base::~ios_base(local_138);
                  iVar3 = 1;
                }
              }
              else {
                result = (NormalizerSpec *)p_Var6[6]._M_nxt;
                name._M_str = (char *)p_Var6[2]._M_nxt;
                name._M_len = (size_t)&local_1b0;
                value._M_str = (char *)result;
                value._M_len = (size_t)p_Var6[1]._M_nxt;
                SetProtoField(name,value,(TrainerSpec *)p_Var6[5]._M_nxt);
                if (CONCAT44(local_1b0.rep_._M_t.
                             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                             _M_head_impl._4_4_,
                             local_1b0.rep_._M_t.
                             super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                             .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                             _M_head_impl._0_4_) == 0) {
                  iVar3 = 3;
                }
                else {
                  SVar4 = util::Status::code(&local_1b0);
                  if (SVar4 == kNotFound) {
                    result = (NormalizerSpec *)p_Var6[6]._M_nxt;
                    name_00._M_str = (char *)p_Var6[2]._M_nxt;
                    name_00._M_len = (size_t)&local_1d8;
                    value_00._M_str = (char *)result;
                    value_00._M_len = (size_t)p_Var6[1]._M_nxt;
                    SetProtoField(name_00,value_00,(NormalizerSpec *)p_Var6[5]._M_nxt);
                    if (CONCAT44(local_1d8.rep_._M_t.
                                 super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                 .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>.
                                 _M_head_impl._4_4_,
                                 (int)local_1d8.rep_._M_t.
                                      super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
                                      .
                                      super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>
                                      ._M_head_impl) == 0) {
                      iVar3 = 3;
                    }
                    else {
                      SVar4 = util::Status::code(&local_1d8);
                      s = &local_1d8;
                      if (SVar4 == kNotFound) {
                        SVar4 = util::Status::code(&local_1b0);
                        iVar3 = 0;
                        if (SVar4 == kNotFound) {
                          SVar4 = util::Status::code(&local_1d8);
                          s = &local_1b0;
                          if (SVar4 == kNotFound) goto LAB_0020c3bd;
                        }
                      }
                      else {
LAB_0020c3bd:
                        iVar3 = 1;
                        util::Status::Status((Status *)local_1d0._M_head_impl,s);
                      }
                    }
                    util::Status::~Status(&local_1d8);
                  }
                  else {
                    iVar3 = 1;
                    util::Status::Status((Status *)local_1d0._M_head_impl,&local_1b0);
                  }
                }
                util::Status::~Status(&local_1b0);
              }
              if ((iVar3 != 3) && (iVar3 != 0)) {
                return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                        )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                          )local_1d0._M_head_impl;
              }
            }
          }
          p_Var6 = p_Var6->_M_nxt;
        } while (p_Var6 != (_Hash_node_base *)0x0);
      }
      util::Status::Status((Status *)local_1d0._M_head_impl);
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )local_1d0._M_head_impl;
    }
    local_1b0.rep_._M_t.
    super___uniq_ptr_impl<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
    ._M_t.
    super__Tuple_impl<0UL,_sentencepiece::util::Status::Rep_*,_std::default_delete<sentencepiece::util::Status::Rep>_>
    .super__Head_base<0UL,_sentencepiece::util::Status::Rep_*,_false>._M_head_impl._0_4_ = 0xd;
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"third_party/sentencepiece/src/sentencepiece_trainer.cc",0x36);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"(",1);
    std::ostream::operator<<(local_1a8,0x87);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"denormalizer_spec",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"`denormalizer_spec` must not be null.",0x25);
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)local_1d0._M_head_impl);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )local_1d0._M_head_impl;
}

Assistant:

util::Status SentencePieceTrainer::MergeSpecsFromArgs(
    const std::unordered_map<std::string, std::string> &kwargs,
    TrainerSpec *trainer_spec, NormalizerSpec *normalizer_spec,
    NormalizerSpec *denormalizer_spec) {
  CHECK_OR_RETURN(trainer_spec) << "`trainer_spec` must not be null.";
  CHECK_OR_RETURN(normalizer_spec) << "`normalizer_spec` must not be null.";
  CHECK_OR_RETURN(denormalizer_spec) << "`denormalizer_spec` must not be null.";

  for (const auto &it : kwargs) {
    const auto &key = it.first;
    const auto &value = it.second;
    // Exceptions.
    if (key == "normalization_rule_name") {
      normalizer_spec->set_name(value);
      continue;
    } else if (key == "denormalization_rule_tsv") {
      denormalizer_spec->set_normalization_rule_tsv(value);
      denormalizer_spec->set_add_dummy_prefix(false);
      denormalizer_spec->set_remove_extra_whitespaces(false);
      denormalizer_spec->set_escape_whitespaces(false);
      continue;
    } else if (key == "minloglevel") {
      int v = 0;
      CHECK_OR_RETURN(absl::SimpleAtoi(value, &v));
      logging::SetMinLogLevel(v);
      continue;
    }

    const auto status_train = SetProtoField(key, value, trainer_spec);
    if (status_train.ok()) continue;
    if (!util::IsNotFound(status_train)) return status_train;

    const auto status_norm = SetProtoField(key, value, normalizer_spec);
    if (status_norm.ok()) continue;
    if (!util::IsNotFound(status_norm)) return status_norm;

    // Not found both in trainer_spec and normalizer_spec.
    if (util::IsNotFound(status_train) && util::IsNotFound(status_norm)) {
      return status_train;
    }
  }

  return util::OkStatus();
}